

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DependenceGraph.h
# Opt level: O1

LLVMNode * __thiscall
dg::DependenceGraph<dg::LLVMNode>::_getNode<llvm::Value*>
          (DependenceGraph<dg::LLVMNode> *this,Value *k)

{
  _Rb_tree_header *p_Var1;
  DGParameterPair<dg::LLVMNode> *pDVar2;
  LLVMNode *pLVar3;
  _Base_ptr p_Var4;
  _Base_ptr p_Var5;
  
  p_Var1 = &(this->nodes)._M_t._M_impl.super__Rb_tree_header;
  p_Var5 = (this->nodes)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  p_Var4 = &p_Var1->_M_header;
  for (; p_Var5 != (_Base_ptr)0x0; p_Var5 = (&p_Var5->_M_left)[*(Value **)(p_Var5 + 1) < k]) {
    if (*(Value **)(p_Var5 + 1) >= k) {
      p_Var4 = p_Var5;
    }
  }
  p_Var5 = &p_Var1->_M_header;
  if (((_Rb_tree_header *)p_Var4 != p_Var1) && (p_Var5 = p_Var4, k < *(Value **)(p_Var4 + 1))) {
    p_Var5 = &p_Var1->_M_header;
  }
  if ((_Rb_tree_header *)p_Var5 == p_Var1) {
    if ((this->formalParameters == (DGParameters<dg::LLVMNode> *)0x0) ||
       (pDVar2 = DGParameters<dg::LLVMNode>::find(this->formalParameters,k),
       pDVar2 == (DGParameterPair<dg::LLVMNode> *)0x0)) {
      pLVar3 = _getGlobalNode<llvm::Value*>(this,k);
      return pLVar3;
    }
    pLVar3 = pDVar2->in;
  }
  else {
    pLVar3 = (LLVMNode *)p_Var5[1]._M_parent;
  }
  return pLVar3;
}

Assistant:

NodeT *_getNode(T k) {
        auto it = nodes.find(k);
        if (it != nodes.end())
            return it->second;

        if (formalParameters) {
            auto p = formalParameters->find(k);
            if (p)
                return p->in;
        }

        return getGlobalNode(k);
    }